

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_x86_xop.cpp
# Opt level: O0

void ncnn::im2col_sgemm_pack8to1_int8_sse_xop
               (Mat *bottom_im2col,Mat *top_blob,Mat *kernel,Option *opt)

{
  Option *in_stack_00000df8;
  Mat *in_stack_00000e00;
  Mat *in_stack_00000e08;
  Mat *in_stack_00000e10;
  
  im2col_sgemm_pack8to1_int8_sse
            (in_stack_00000e10,in_stack_00000e08,in_stack_00000e00,in_stack_00000df8);
  return;
}

Assistant:

void im2col_sgemm_pack8to1_int8_sse_xop(const Mat& bottom_im2col, Mat& top_blob, const Mat& kernel, const Option& opt)
{
    im2col_sgemm_pack8to1_int8_sse(bottom_im2col, top_blob, kernel, opt);
}